

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

bool vk::checkAndLog(TestLog *log,AllocationCallbackValidationResults *results,
                    deUint32 allowedLiveAllocScopeBits)

{
  AllocationCallbackRecord *pAVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  MessageBuilder *pMVar5;
  const_reference pvVar6;
  AllocationCallbackRecord *pAVar7;
  bool local_921;
  VkSystemAllocationScope local_888;
  VkSystemAllocationScope local_884;
  MessageBuilder local_810;
  unsigned_long local_690;
  MessageBuilder local_688;
  size_t local_508;
  size_t totalAllocated;
  VkSystemAllocationScope scope_1;
  VkInternalAllocationType type;
  int scopeNdx;
  int internalAllocTypeNdx;
  MessageBuilder local_4e8;
  VkSystemAllocationScope local_364;
  const_reference pvStack_360;
  VkSystemAllocationScope scope;
  AllocationCallbackRecord *record;
  size_t liveNdx;
  MessageBuilder local_348;
  unsigned_long local_1c8 [3];
  MessageBuilder local_1b0;
  ulong local_30;
  size_t violationNdx;
  size_t numLeaks;
  AllocationCallbackValidationResults *pAStack_18;
  deUint32 allowedLiveAllocScopeBits_local;
  AllocationCallbackValidationResults *results_local;
  TestLog *log_local;
  
  violationNdx = 0;
  numLeaks._4_4_ = allowedLiveAllocScopeBits;
  pAStack_18 = results;
  results_local = (AllocationCallbackValidationResults *)log;
  bVar3 = std::
          vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
          ::empty(&results->violations);
  if (!bVar3) {
    for (local_30 = 0; uVar2 = local_30,
        sVar4 = std::
                vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
                ::size(&pAStack_18->violations), uVar2 < sVar4; local_30 = local_30 + 1) {
      tcu::TestLog::operator<<
                (&local_1b0,(TestLog *)results_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [11])"VIOLATION ");
      local_1c8[0] = local_30 + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x134fa06);
      pvVar6 = std::
               vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ::operator[](&pAStack_18->violations,local_30);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvVar6);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x12c67a9);
      pvVar6 = std::
               vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
               ::operator[](&pAStack_18->violations,local_30);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pvVar6->record);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12d99d9);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    }
    tcu::TestLog::operator<<
              (&local_348,(TestLog *)results_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [14])"ERROR: Found ");
    liveNdx = std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::size(&pAStack_18->violations);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&liveNdx);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [31])" invalid allocation callbacks!")
    ;
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
  }
  for (record = (AllocationCallbackRecord *)0x0; pAVar1 = record,
      pAVar7 = (AllocationCallbackRecord *)
               std::
               vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>::
               size(&pAStack_18->liveAllocations), pAVar1 < pAVar7;
      record = (AllocationCallbackRecord *)((long)&record->type + 1)) {
    pvStack_360 = std::
                  vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                  ::operator[](&pAStack_18->liveAllocations,(size_type)record);
    if (pvStack_360->type == TYPE_ALLOCATION) {
      local_884 = (pvStack_360->data).allocation.scope;
    }
    else {
      if (pvStack_360->type == TYPE_REALLOCATION) {
        local_888 = (pvStack_360->data).reallocation.scope;
      }
      else {
        local_888 = VK_SYSTEM_ALLOCATION_SCOPE_LAST;
      }
      local_884 = local_888;
    }
    local_364 = local_884;
    if ((numLeaks._4_4_ & 1 << ((byte)local_884 & 0x1f)) == 0) {
      tcu::TestLog::operator<<
                (&local_4e8,(TestLog *)results_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_4e8,(char (*) [6])"LEAK ");
      _scopeNdx = violationNdx + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(unsigned_long *)&scopeNdx);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x134fa06);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pvStack_360);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e8);
      violationNdx = violationNdx + 1;
    }
  }
  for (type = VK_INTERNAL_ALLOCATION_TYPE_EXECUTABLE; (int)type < 1;
      type = type + VK_INTERNAL_ALLOCATION_TYPE_LAST) {
    for (scope_1 = VK_SYSTEM_ALLOCATION_SCOPE_COMMAND; (int)scope_1 < 5;
        scope_1 = scope_1 + VK_SYSTEM_ALLOCATION_SCOPE_OBJECT) {
      totalAllocated._4_4_ = type;
      totalAllocated._0_4_ = scope_1;
      local_508 = pAStack_18->internalAllocationTotal[type][scope_1];
      if (((numLeaks._4_4_ & 1 << ((byte)scope_1 & 0x1f)) == 0) && (local_508 != 0)) {
        tcu::TestLog::operator<<
                  (&local_688,(TestLog *)results_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [6])"LEAK ");
        local_690 = violationNdx + 1;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_690);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x134fa06);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_508);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])" bytes of (");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(VkInternalAllocationType *)((long)&totalAllocated + 4));
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x132ea91);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(VkSystemAllocationScope *)&totalAllocated);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [37])") internal memory is still allocated");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_688);
        violationNdx = violationNdx + 1;
      }
    }
  }
  if (violationNdx != 0) {
    tcu::TestLog::operator<<
              (&local_810,(TestLog *)results_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_810,(char (*) [14])"ERROR: Found ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&violationNdx);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])" memory leaks!");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_810);
  }
  local_921 = std::
              vector<vk::AllocationCallbackViolation,_std::allocator<vk::AllocationCallbackViolation>_>
              ::empty(&pAStack_18->violations);
  local_921 = local_921 && violationNdx == 0;
  return local_921;
}

Assistant:

bool checkAndLog (tcu::TestLog& log, const AllocationCallbackValidationResults& results, deUint32 allowedLiveAllocScopeBits)
{
	using tcu::TestLog;

	size_t	numLeaks	= 0;

	if (!results.violations.empty())
	{
		for (size_t violationNdx = 0; violationNdx < results.violations.size(); ++violationNdx)
		{
			log << TestLog::Message << "VIOLATION " << (violationNdx+1)
													<< ": " << results.violations[violationNdx]
													<< " (" << results.violations[violationNdx].record << ")"
				<< TestLog::EndMessage;
		}

		log << TestLog::Message << "ERROR: Found " << results.violations.size() << " invalid allocation callbacks!" << TestLog::EndMessage;
	}

	// Verify live allocations
	for (size_t liveNdx = 0; liveNdx < results.liveAllocations.size(); ++liveNdx)
	{
		const AllocationCallbackRecord&		record	= results.liveAllocations[liveNdx];
		const VkSystemAllocationScope		scope	= record.type == AllocationCallbackRecord::TYPE_ALLOCATION		? record.data.allocation.scope
													: record.type == AllocationCallbackRecord::TYPE_REALLOCATION	? record.data.reallocation.scope
													: VK_SYSTEM_ALLOCATION_SCOPE_LAST;

		DE_ASSERT(de::inBounds(scope, (VkSystemAllocationScope)0, VK_SYSTEM_ALLOCATION_SCOPE_LAST));

		if ((allowedLiveAllocScopeBits & (1u << scope)) == 0)
		{
			log << TestLog::Message << "LEAK " << (numLeaks+1) << ": " << record << TestLog::EndMessage;
			numLeaks += 1;
		}
	}

	// Verify internal allocations
	for (int internalAllocTypeNdx = 0; internalAllocTypeNdx < VK_INTERNAL_ALLOCATION_TYPE_LAST; ++internalAllocTypeNdx)
	{
		for (int scopeNdx = 0; scopeNdx < VK_SYSTEM_ALLOCATION_SCOPE_LAST; ++scopeNdx)
		{
			const VkInternalAllocationType	type			= (VkInternalAllocationType)internalAllocTypeNdx;
			const VkSystemAllocationScope	scope			= (VkSystemAllocationScope)scopeNdx;
			const size_t					totalAllocated	= results.internalAllocationTotal[type][scope];

			if ((allowedLiveAllocScopeBits & (1u << scopeNdx)) == 0 &&
				totalAllocated > 0)
			{
				log << TestLog::Message << "LEAK " << (numLeaks+1) << ": " << totalAllocated
										<< " bytes of (" << type << ", " << scope << ") internal memory is still allocated"
					<< TestLog::EndMessage;
				numLeaks += 1;
			}
		}
	}

	if (numLeaks > 0)
		log << TestLog::Message << "ERROR: Found " << numLeaks << " memory leaks!" << TestLog::EndMessage;

	return results.violations.empty() && numLeaks == 0;
}